

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanStreamStart(Scanner *this)

{
  char cVar1;
  size_t sStack_60;
  undefined1 local_58 [24];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  this->IsStartOfStream = false;
  local_58._0_8_ = this->Current;
  local_58._8_8_ = this->End + -local_58._0_8_;
  if ((iterator)local_58._8_8_ != (iterator)0x0) {
    cVar1 = StringRef::operator[]((StringRef *)local_58,0);
    if (cVar1 == -1) {
      if (((((ulong)local_58._8_8_ < (iterator)0x4) ||
           (cVar1 = StringRef::operator[]((StringRef *)local_58,1), cVar1 != -2)) ||
          (cVar1 = StringRef::operator[]((StringRef *)local_58,2), cVar1 != '\0')) ||
         (cVar1 = StringRef::operator[]((StringRef *)local_58,3), cVar1 != '\0')) {
        if (((ulong)local_58._8_8_ < (iterator)0x2) ||
           (cVar1 = StringRef::operator[]((StringRef *)local_58,1), cVar1 != -2)) goto LAB_00dc83a9;
LAB_00dc8357:
        sStack_60 = 2;
      }
      else {
LAB_00dc83f9:
        sStack_60 = 4;
      }
LAB_00dc8359:
      goto LAB_00dc83ac;
    }
    if (cVar1 == -0x11) {
      if ((((iterator)0x2 < (ulong)local_58._8_8_) &&
          (cVar1 = StringRef::operator[]((StringRef *)local_58,1), cVar1 == -0x45)) &&
         (cVar1 = StringRef::operator[]((StringRef *)local_58,2), cVar1 == -0x41)) {
        sStack_60 = 3;
        goto LAB_00dc8359;
      }
    }
    else if (cVar1 == -2) {
      if (((iterator)0x1 < (ulong)local_58._8_8_) &&
         (cVar1 = StringRef::operator[]((StringRef *)local_58,1), cVar1 == -1)) goto LAB_00dc8357;
    }
    else {
      if (cVar1 == '\0') {
        if ((iterator)0x3 < (ulong)local_58._8_8_) {
          cVar1 = StringRef::operator[]((StringRef *)local_58,1);
          if (((cVar1 == '\0') &&
              (cVar1 = StringRef::operator[]((StringRef *)local_58,2), cVar1 == -2)) &&
             (cVar1 = StringRef::operator[]((StringRef *)local_58,3), cVar1 == -1))
          goto LAB_00dc83f9;
          cVar1 = StringRef::operator[]((StringRef *)local_58,1);
          if (((cVar1 == '\0') &&
              (cVar1 = StringRef::operator[]((StringRef *)local_58,2), cVar1 == '\0')) &&
             (cVar1 = StringRef::operator[]((StringRef *)local_58,3), cVar1 != '\0'))
          goto LAB_00dc83a9;
        }
      }
      else if (((((iterator)0x3 < (ulong)local_58._8_8_) &&
                (cVar1 = StringRef::operator[]((StringRef *)local_58,1), cVar1 == '\0')) &&
               (cVar1 = StringRef::operator[]((StringRef *)local_58,2), cVar1 == '\0')) &&
              (cVar1 = StringRef::operator[]((StringRef *)local_58,3), cVar1 == '\0'))
      goto LAB_00dc83a9;
      if ((iterator)0x1 < (ulong)local_58._8_8_) {
        StringRef::operator[]((StringRef *)local_58,1);
      }
    }
  }
LAB_00dc83a9:
  sStack_60 = 0;
LAB_00dc83ac:
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_58._0_4_ = 1;
  local_58._8_8_ = this->Current;
  local_58._16_8_ = sStack_60;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_58);
  this->Current = this->Current + sStack_60;
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool Scanner::scanStreamStart() {
  IsStartOfStream = false;

  EncodingInfo EI = getUnicodeEncoding(currentInput());

  Token T;
  T.Kind = Token::TK_StreamStart;
  T.Range = StringRef(Current, EI.second);
  TokenQueue.push_back(T);
  Current += EI.second;
  return true;
}